

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_script.cpp
# Opt level: O2

void __thiscall Script_Script_hex_exception_Test::TestBody(Script_Script_hex_exception_Test *this)

{
  char *in_R9;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  sStack_78;
  AssertHelper local_70;
  string hex;
  Script script;
  
  std::__cxx11::string::string((string *)&hex,"xxxx",(allocator *)&script);
  cfd::core::Script::Script(&script,&hex);
  cfd::core::Script::~Script(&script);
  std::__cxx11::string::~string((string *)&hex);
  hex._M_dataplus._M_p._0_1_ = 0;
  hex._M_string_length = 0;
  testing::Message::Message((Message *)&sStack_78);
  testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
            ((string *)&script,(internal *)&hex,(AssertionResult *)0x414853,"false","true",in_R9);
  testing::internal::AssertHelper::AssertHelper
            (&local_70,kFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_script.cpp"
             ,0x35,(char *)script._vptr_Script);
  testing::internal::AssertHelper::operator=(&local_70,(Message *)&sStack_78);
  testing::internal::AssertHelper::~AssertHelper(&local_70);
  std::__cxx11::string::~string((string *)&script);
  testing::internal::
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~scoped_ptr(&sStack_78);
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&hex._M_string_length);
  return;
}

Assistant:

TEST(Script, Script_hex_exception) {
  try {
    std::string hex("xxxx");
    Script script(hex);
  } catch (const cfd::core::CfdException &cfd_except) {
    EXPECT_STREQ(cfd_except.what(), "hex to byte convert error.");
    return;
  }
  ASSERT_TRUE(false);
}